

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall mp::NLSolver::InitAutoStub(NLSolver *this)

{
  string *__rhs;
  NLUtils *pNVar1;
  uint uVar2;
  ulong uVar3;
  result_type rVar4;
  size_t sVar5;
  char *pcVar6;
  long *plVar7;
  size_t __i;
  long lVar8;
  long *plVar9;
  path path;
  uniform_int_distribution<unsigned_long> rand;
  mt19937 prng;
  random_device dev;
  long *local_27f0;
  long local_27e8;
  long local_27e0;
  undefined4 uStack_27d8;
  undefined4 uStack_27d4;
  path local_27d0;
  uniform_int_distribution<unsigned_long> local_27a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2798;
  char local_2778 [72];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  random_device local_13a8;
  
  std::random_device::random_device(&local_13a8);
  uVar2 = std::random_device::_M_getval();
  local_2730._M_x[0] = (unsigned_long)uVar2;
  lVar8 = 1;
  uVar3 = local_2730._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar8);
    local_2730._M_x[lVar8] = uVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_2730._M_p = 0x270;
  local_27a8._M_param._M_a = 0;
  local_27a8._M_param._M_b = 0xffffffffffffffff;
  std::filesystem::temp_directory_path_abi_cxx11_();
  std::filesystem::__cxx11::path::_M_append(&local_27d0,5,"nlw2_");
  local_2778[8] = '\0';
  local_2778[9] = '\0';
  local_2778[10] = '\0';
  local_2778[0xb] = '\0';
  local_2778[0xc] = '\0';
  local_2778[0xd] = '\0';
  local_2778[0xe] = '\0';
  local_2778[0xf] = '\0';
  local_2778[0x30] = '\0';
  local_2778[0x31] = '\0';
  local_2778[0x32] = '\0';
  local_2778[0x33] = '\0';
  local_2778[0x34] = '\0';
  local_2778[0x35] = '\0';
  local_2778[0x36] = '\0';
  local_2778[0x37] = '\0';
  local_2778[0x38] = '\0';
  local_2778[0x39] = '\0';
  local_2778[0x3a] = '\0';
  local_2778[0x3b] = '\0';
  local_2778[0x3c] = '\0';
  local_2778[0x3d] = '\0';
  local_2778[0x3e] = '\0';
  local_2778[0x3f] = '\0';
  local_2778[0x20] = '\0';
  local_2778[0x21] = '\0';
  local_2778[0x22] = '\0';
  local_2778[0x23] = '\0';
  local_2778[0x24] = '\0';
  local_2778[0x25] = '\0';
  local_2778[0x26] = '\0';
  local_2778[0x27] = '\0';
  local_2778[0x28] = '\0';
  local_2778[0x29] = '\0';
  local_2778[0x2a] = '\0';
  local_2778[0x2b] = '\0';
  local_2778[0x2c] = '\0';
  local_2778[0x2d] = '\0';
  local_2778[0x2e] = '\0';
  local_2778[0x2f] = '\0';
  local_2778[0x10] = '\0';
  local_2778[0x11] = '\0';
  local_2778[0x12] = '\0';
  local_2778[0x13] = '\0';
  local_2778[0x14] = '\0';
  local_2778[0x15] = '\0';
  local_2778[0x16] = '\0';
  local_2778[0x17] = '\0';
  local_2778[0x18] = '\0';
  local_2778[0x19] = '\0';
  local_2778[0x1a] = '\0';
  local_2778[0x1b] = '\0';
  local_2778[0x1c] = '\0';
  local_2778[0x1d] = '\0';
  local_2778[0x1e] = '\0';
  local_2778[0x1f] = '\0';
  builtin_strncpy(local_2778,"rndhex",7);
  local_2778[7] = '\0';
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_27a8,&local_2730,&local_27a8._M_param);
  snprintf(local_2778,0x3f,"%lX",rVar4);
  sVar5 = strlen(local_2778);
  std::filesystem::__cxx11::path::_M_concat(&local_27d0,sVar5,local_2778);
  std::filesystem::__cxx11::path::_M_concat(&local_27d0,7,"_XXXXXX");
  local_27f0 = &local_27e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_27f0,local_27d0._M_pathname._M_dataplus._M_p,
             local_27d0._M_pathname._M_dataplus._M_p + local_27d0._M_pathname._M_string_length);
  __rhs = &this->pathstr_;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_27f0);
  if (local_27f0 != &local_27e0) {
    operator_delete(local_27f0,local_27e0 + 1);
  }
  pcVar6 = mkdtemp((__rhs->_M_dataplus)._M_p);
  if (pcVar6 == (char *)0x0) {
    pNVar1 = this->p_ut_;
    std::operator+(&local_2798,"Could not create a temp dir\nfrom pattern \'",__rhs);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2798);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_27e0 = *plVar9;
      uStack_27d8 = (undefined4)plVar7[3];
      uStack_27d4 = *(undefined4 *)((long)plVar7 + 0x1c);
      local_27f0 = &local_27e0;
    }
    else {
      local_27e0 = *plVar9;
      local_27f0 = (long *)*plVar7;
    }
    local_27e8 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (*pNVar1->_vptr_NLUtils[7])(pNVar1);
    if (local_27f0 != &local_27e0) {
      operator_delete(local_27f0,local_27e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2798._M_dataplus._M_p != &local_2798.field_2) {
      operator_delete(local_2798._M_dataplus._M_p,local_2798.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::operator=(&local_27d0,__rhs);
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_27a8,&local_2730,&local_27a8._M_param);
  snprintf(local_2778,0x3f,"%lX",rVar4);
  sVar5 = strlen(local_2778);
  std::filesystem::__cxx11::path::_M_append(&local_27d0,sVar5,local_2778);
  local_27f0 = &local_27e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_27f0,local_27d0._M_pathname._M_dataplus._M_p,
             local_27d0._M_pathname._M_dataplus._M_p + local_27d0._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)&this->filestub_,(string *)&local_27f0);
  if (local_27f0 != &local_27e0) {
    operator_delete(local_27f0,local_27e0 + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_27d0);
  std::random_device::_M_fini();
  return;
}

Assistant:

void NLSolver::InitAutoStub() {
  // init file stub
  std::random_device dev;
  std::mt19937 prng(dev());
  std::uniform_int_distribution<unsigned long> rand(0);
  auto path = std::filesystem::temp_directory_path();
  path /= "nlw2_"; // via '/'
  char rnds[64] = "rndhex";
  std::snprintf(rnds, sizeof(rnds)-1, "%lX", rand(prng));
  path += rnds;    // no '/'

  path += "_XXXXXX";
  pathstr_ = path.string();

#if defined(_WIN32) || defined(_WIN64)
  auto p1 = _mktemp((char*)pathstr_.c_str());
  assert(p1);
  if (!std::filesystem::create_directory(pathstr_))
    Utils().myexit("Could not create temp dir '"
                   + pathstr_ + "'");
#else
  if (!mkdtemp((char*)pathstr_.c_str()))
    Utils().myexit("Could not create a temp dir\n"
                   "from pattern '" + pathstr_ + "'");
#endif
  path = pathstr_;
  // Plus filename
  std::snprintf(rnds, sizeof(rnds)-1, "%lX", rand(prng));
  path /= rnds;
  filestub_ = path.string();
}